

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::GetProperty_Internal<false>
               (Var instance,RecyclableObject *propertyObject,bool isRoot,PropertyId propertyId,
               Var *value,ScriptContext *requestContext,PropertyValueInfo *info)

{
  Type TVar1;
  Type *pTVar2;
  long *plVar3;
  code *pcVar4;
  Var cacheInstance;
  undefined4 uVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  undefined4 extraout_var;
  PropertyRecord *pPVar11;
  RecyclableObject *pRVar12;
  RecyclableObject *pRVar13;
  RecyclableObject *pRVar14;
  undefined7 in_register_00000011;
  DynamicObject *dynamicObject;
  Var local_48;
  Var property;
  undefined4 local_38;
  uint local_34;
  
  local_34 = propertyId;
  bVar6 = VarIs<Js::RecyclableObject>(instance);
  if (!bVar6) {
    PropertyValueInfo::ClearCacheInfo(info);
  }
  local_38 = (undefined4)CONCAT71(in_register_00000011,isRoot);
  if (isRoot) {
    if ((((propertyObject->type).ptr)->typeId & ~TypeIds_Null) != TypeIds_GlobalObject) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x755,"(VarIs<RootObjectBase>(object))",
                                  "VarIs<RootObjectBase>(object)");
      if (!bVar6) goto LAB_00ac2436;
      *puVar10 = 0;
    }
    iVar8 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x6c])
                      (propertyObject,instance,(ulong)local_34,value,info,requestContext);
    pRVar14 = propertyObject;
    if (iVar8 != 0) {
LAB_00ac2267:
      bVar6 = DynamicObject::IsBaseDynamicObject(propertyObject);
      if (bVar6) {
        plVar3 = *(long **)((propertyObject->type).ptr + 1);
        pPVar11 = ScriptContext::GetPropertyName(requestContext,local_34);
        cVar7 = (**(code **)(*plVar3 + 0x2e0))(plVar3,pPVar11,&local_48,requestContext);
        if ((value != (Var *)0x0) && (cVar7 != '\0')) {
          bVar6 = VarIs<Js::RecyclableObject>(local_48);
          if (bVar6) {
            pRVar12 = VarTo<Js::RecyclableObject>(local_48);
            pRVar13 = VarTo<Js::RecyclableObject>(*value);
            if ((((((pRVar13->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr !=
                (((((pRVar12->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr) goto LAB_00ac2354;
          }
          if (*value != local_48) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x789,
                                        "(skipAssert || value == nullptr || *value == property)",
                                        "skipAssert || value == nullptr || *value == property");
            if (!bVar6) {
LAB_00ac2436:
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            *puVar10 = 0;
          }
        }
      }
LAB_00ac2354:
      if (value == (Var *)0x0) {
        return 1;
      }
      if ((((requestContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).
          ptr == (UndeclaredBlockVariable *)*value) {
        return 1;
      }
      bVar6 = VarIs<Js::UnscopablesWrapperObject,Js::RecyclableObject>(propertyObject);
      if (bVar6) {
        return 1;
      }
      CacheOperators::CachePropertyRead
                (pRVar14,propertyObject,local_38._0_1_,local_34,false,info,requestContext);
      return 1;
    }
  }
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  TVar1 = ((propertyObject->type).ptr)->typeId;
  property = propertyObject;
  do {
    if (TVar1 == TypeIds_Null) {
LAB_00ac23a7:
      bVar6 = Phases::IsEnabled((Phases *)&DAT_015b3868,MissingPropertyCachePhase);
      if (bVar6) {
        ScriptContext::RecordMissingPropertyMiss(requestContext);
      }
      bVar6 = Phases::IsEnabled((Phases *)&DAT_015b6718,MissingPropertyCachePhase);
      uVar5 = local_38;
      cacheInstance = property;
      if (bVar6) {
        Output::Print(L"MissingPropertyCaching: Missing property %d on slow path.\n",(ulong)local_34
                     );
      }
      TryCacheMissingProperty(instance,cacheInstance,SUB41(uVar5,0),local_34,requestContext,info);
      pRVar14 = ScriptContext::GetMissingPropertyResult(requestContext);
      *value = pRVar14;
      return 0;
    }
    iVar8 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x12])
                      (propertyObject,instance,(ulong)local_34,value,info,requestContext);
    if (iVar8 != 0) {
      pRVar14 = (RecyclableObject *)property;
      if (iVar8 == 1) goto LAB_00ac2267;
      goto LAB_00ac23a7;
    }
    BVar9 = RecyclableObject::SkipsPrototype(propertyObject);
    if (BVar9 != 0) goto LAB_00ac23a7;
    pTVar2 = (propertyObject->type).ptr;
    if ((pTVar2->flags & TypeFlagMask_HasSpecialPrototype) == TypeFlagMask_None) {
LAB_00ac222f:
      propertyObject = (pTVar2->prototype).ptr;
    }
    else if (pTVar2->typeId == TypeIds_Proxy) {
      propertyObject = (pTVar2->prototype).ptr;
      if (propertyObject !=
          (((((((pTVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).nullValue.ptr)
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x57a,
                                    "(type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull())"
                                    ,
                                    "type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull()"
                                   );
        if (bVar6) {
          *puVar10 = 0;
          goto LAB_00ac222f;
        }
        goto LAB_00ac2436;
      }
    }
    else {
      iVar8 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[6])(propertyObject);
      propertyObject = (RecyclableObject *)CONCAT44(extraout_var,iVar8);
    }
    TVar1 = ((propertyObject->type).ptr)->typeId;
  } while( true );
}

Assistant:

BOOL JavascriptOperators::GetProperty_Internal(Var instance, RecyclableObject* propertyObject, const bool isRoot, PropertyId propertyId, Var* value, ScriptContext* requestContext, PropertyValueInfo* info)
    {
        if (TaggedNumber::Is(instance))
        {
            PropertyValueInfo::ClearCacheInfo(info);
        }
        RecyclableObject* object = propertyObject;
        BOOL foundProperty = FALSE;
        if (isRoot)
        {
            Assert(VarIs<RootObjectBase>(object));

            RootObjectBase* rootObject = static_cast<RootObjectBase*>(object);
            foundProperty = rootObject->GetRootProperty(instance, propertyId, value, info, requestContext);
        }

        while (!foundProperty && !JavascriptOperators::IsNull(object))
        {
            if (unscopables && IsPropertyUnscopable(object, propertyId))
            {
                break;
            }
            else
            {
                PropertyQueryFlags result = object->GetPropertyQuery(instance, propertyId, value, info, requestContext);
                if (result != PropertyQueryFlags::Property_NotFound)
                {
                    foundProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(result);
                    break;
                }
            }

            if (object->SkipsPrototype())
            {
                break;
            }

            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }

        if (foundProperty)
        {
#if ENABLE_FIXED_FIELDS && DBG
            if (DynamicObject::IsBaseDynamicObject(object))
            {
                DynamicObject* dynamicObject = (DynamicObject*)object;
                DynamicTypeHandler* dynamicTypeHandler = dynamicObject->GetDynamicType()->GetTypeHandler();
                Var property;
                if (dynamicTypeHandler->CheckFixedProperty(requestContext->GetPropertyName(propertyId), &property, requestContext))
                {
                    bool skipAssert = false;
                    if (value != nullptr && Js::VarIs<Js::RecyclableObject>(property))
                    {
                        Js::RecyclableObject* pObject = Js::VarTo<Js::RecyclableObject>(property);
                        Js::RecyclableObject* pValue = Js::VarTo<Js::RecyclableObject>(*value);

                        if (pValue->GetScriptContext() != pObject->GetScriptContext())
                        {
                            // value was marshaled. skip check
                            skipAssert = true;
                        }
                    }
                    Assert(skipAssert || value == nullptr || *value == property);
                }
            }
#endif
            // Don't cache the information if the value is undecl block var
            // REVIEW: We might want to only check this if we need to (For LdRootFld or ScopedLdFld)
            //         Also we might want to throw here instead of checking it again in the caller
            if (value && !requestContext->IsUndeclBlockVar(*value) && !VarIs<UnscopablesWrapperObject>(object))
            {
                CacheOperators::CachePropertyRead(propertyObject, object, isRoot, propertyId, false, info, requestContext);
            }
#ifdef TELEMETRY_JSO
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, value, /*successful: */true);
            }
#endif

            return TRUE;
        }

        else
        {
#ifdef MISSING_PROPERTY_STATS
            if (PHASE_STATS1(MissingPropertyCachePhase))
            {
                requestContext->RecordMissingPropertyMiss();
            }
#endif
            if (PHASE_TRACE1(MissingPropertyCachePhase))
            {
                Output::Print(_u("MissingPropertyCaching: Missing property %d on slow path.\n"), propertyId);
            }

            TryCacheMissingProperty(instance, propertyObject, isRoot, propertyId, requestContext, info);

#if defined(TELEMETRY_JSO) || defined(TELEMETRY_AddToCache) // enabled for `TELEMETRY_AddToCache`, because this is the property-not-found codepath where the normal TELEMETRY_AddToCache code wouldn't be executed.
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                if (info && info->AllowResizingPolymorphicInlineCache()) // If in interpreted mode, not JIT.
                {
                    requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, nullptr);
                }
            }
#endif
            *value = requestContext->GetMissingPropertyResult();
            return FALSE;
        }
    }